

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

int64_t CoreML::Specification::rankOf(ArrayFeatureType *marray)

{
  RepeatedField<long> *pRVar1;
  
  if (marray->_oneof_case_[0] != 0) {
    if (marray->_oneof_case_[0] == 0x1f) {
      pRVar1 = (RepeatedField<long> *)
               &(((marray->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                super_RepeatedPtrFieldBase.current_size_;
      goto LAB_002983ef;
    }
    marray = (ArrayFeatureType *)
             google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                       (&(((marray->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                         super_RepeatedPtrFieldBase,0);
  }
  pRVar1 = &marray->shape_;
LAB_002983ef:
  return (long)pRVar1->current_size_;
}

Assistant:

static inline int64_t rankOf(const Specification::ArrayFeatureType &marray) {
            switch (marray.ShapeFlexibility_case()) {
                case Specification::ArrayFeatureType::kEnumeratedShapes:
                    return marray.enumeratedshapes().shapes(0).shape_size();
                case  Specification::ArrayFeatureType::kShapeRange:
                    return marray.shaperange().sizeranges_size();
                case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                    return marray.shape_size();
            }
        }